

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O1

int SSL_set_max_proto_version(SSL *ssl,uint16_t version)

{
  SSL_CONFIG *pSVar1;
  bool bVar2;
  uint16_t uVar3;
  uint16_t *out;
  
  pSVar1 = (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
  if (pSVar1 == (SSL_CONFIG *)0x0) {
    return 0;
  }
  out = &pSVar1->conf_max_version;
  if (version != 0) {
    bVar2 = bssl::set_version_bound(ssl->method,out,version);
    return (int)bVar2;
  }
  uVar3 = 0x304;
  if (ssl->method->is_dtls != false) {
    uVar3 = 0xfefd;
  }
  *out = uVar3;
  return 1;
}

Assistant:

int SSL_set_max_proto_version(SSL *ssl, uint16_t version) {
  if (!ssl->config) {
    return 0;
  }
  return set_max_version(ssl->method, &ssl->config->conf_max_version, version);
}